

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeRollback(Btree *p,int tripCode,int writeOnly)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int rc2_1;
  int rc2;
  BtShared *pBt;
  int rc;
  MemPage *pPage1;
  BtCursor *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  Pgno in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Btree *pBtree;
  undefined4 in_stack_ffffffffffffffd8;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pBtree = *(Btree **)(in_RDI + 8);
  sqlite3BtreeEnter((Btree *)0x13d39e);
  if (in_ESI == 0) {
    iVar2 = saveAllCursors((BtShared *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                           ,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
    local_1c = iVar2;
  }
  else {
    iVar2 = 0;
    local_1c = in_ESI;
  }
  if ((local_1c != 0) &&
     (in_stack_ffffffffffffffcc =
           sqlite3BtreeTripAllCursors(pBtree,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
     in_stack_ffffffffffffffcc != 0)) {
    iVar2 = in_stack_ffffffffffffffcc;
  }
  if (*(char *)(in_RDI + 0x10) == '\x02') {
    iVar3 = sqlite3PagerRollback((Pager *)CONCAT44(in_stack_ffffffffffffffcc,0xaaaaaaaa));
    if (iVar3 != 0) {
      iVar2 = iVar3;
    }
    iVar3 = btreeGetPage((BtShared *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),
                         (Pgno)((ulong)pBtree >> 0x20),
                         (MemPage **)CONCAT44(in_stack_ffffffffffffffcc,iVar3),
                         in_stack_ffffffffffffffc4);
    if (iVar3 == 0) {
      btreeSetNPage((BtShared *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (MemPage *)in_stack_ffffffffffffffb8);
      releasePageOne((MemPage *)0x13d46e);
    }
    *(undefined1 *)((long)&pBtree->pNext + 4) = 1;
    btreeClearHasContent((BtShared *)0x13d481);
  }
  btreeEndTransaction((Btree *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  sqlite3BtreeLeave((Btree *)0x13d495);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeRollback(Btree *p, int tripCode, int writeOnly){
  int rc;
  BtShared *pBt = p->pBt;
  MemPage *pPage1;

  assert( writeOnly==1 || writeOnly==0 );
  assert( tripCode==SQLITE_ABORT_ROLLBACK || tripCode==SQLITE_OK );
  sqlite3BtreeEnter(p);
  if( tripCode==SQLITE_OK ){
    rc = tripCode = saveAllCursors(pBt, 0, 0);
    if( rc ) writeOnly = 0;
  }else{
    rc = SQLITE_OK;
  }
  if( tripCode ){
    int rc2 = sqlite3BtreeTripAllCursors(p, tripCode, writeOnly);
    assert( rc==SQLITE_OK || (writeOnly==0 && rc2==SQLITE_OK) );
    if( rc2!=SQLITE_OK ) rc = rc2;
  }
  btreeIntegrity(p);

  if( p->inTrans==TRANS_WRITE ){
    int rc2;

    assert( TRANS_WRITE==pBt->inTransaction );
    rc2 = sqlite3PagerRollback(pBt->pPager);
    if( rc2!=SQLITE_OK ){
      rc = rc2;
    }

    /* The rollback may have destroyed the pPage1->aData value.  So
    ** call btreeGetPage() on page 1 again to make
    ** sure pPage1->aData is set correctly. */
    if( btreeGetPage(pBt, 1, &pPage1, 0)==SQLITE_OK ){
      btreeSetNPage(pBt, pPage1);
      releasePageOne(pPage1);
    }
    assert( countValidCursors(pBt, 1)==0 );
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return rc;
}